

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_tran_dialer_closed(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  char *pcVar5;
  nng_socket local_30;
  nng_dialer local_2c;
  nng_socket s;
  nng_dialer d;
  
  local_30.id = 0;
  local_2c.id = 0;
  pcVar4 = strchr(scheme,0x36);
  if (pcVar4 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x114,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr(scheme,0x40,nuts_tran_dialer_closed::nuts_addr_);
  nVar2 = nng_pair1_open(&local_30);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x116,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_dialer_create(&local_2c,local_30,nuts_tran_dialer_closed::nuts_addr_);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x117,"%s: expected success, got %s (%d)",
                           "nng_dialer_create(&d, s, addr)",pcVar4,nVar2);
    if (iVar3 != 0) {
      iVar3 = nng_dialer_id(local_2c);
      acutest_check_((uint)(0 < iVar3),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x118,"%s","nng_dialer_id(d) > 0");
      nVar2 = nng_dialer_close(local_2c);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x119,"%s: expected success, got %s (%d)","nng_dialer_close(d)",pcVar4
                             ,nVar2);
      if (iVar3 != 0) {
        num = nng_dialer_start(local_2c,0);
        pcVar4 = nng_strerror(NNG_ENOENT);
        acutest_check_((uint)(num == NNG_ENOENT),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                       ,0x11a,"%s fails with %s","nng_dialer_start(d, 0)",pcVar4,nVar2);
        pcVar4 = nng_strerror(NNG_ENOENT);
        pcVar5 = nng_strerror(num);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_dialer_start(d, 0)",pcVar4,0xc,
                         pcVar5,(ulong)num);
        nVar2 = nng_socket_close(local_30);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x11b,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                               pcVar4,nVar2);
        if (iVar3 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_dialer_closed(const char *scheme)
{
	nng_socket  s = NNG_SOCKET_INITIALIZER;
	nng_dialer  d = NNG_DIALER_INITIALIZER;
	const char *addr;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR(addr, scheme);
	NUTS_OPEN(s);
	NUTS_PASS(nng_dialer_create(&d, s, addr));
	NUTS_TRUE(nng_dialer_id(d) > 0);
	NUTS_PASS(nng_dialer_close(d));
	NUTS_FAIL(nng_dialer_start(d, 0), NNG_ENOENT);
	NUTS_CLOSE(s);
}